

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void arena_set(uint ind,arena_t *arena)

{
  arena_t *arena_local;
  uint ind_local;
  
  arenas[ind].repr = arena;
  return;
}

Assistant:

void
arena_set(unsigned ind, arena_t *arena) {
	atomic_store_p(&arenas[ind], arena, ATOMIC_RELEASE);
}